

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotest.c
# Opt level: O3

int done_testing(void)

{
  long lVar1;
  
  if (test_level == 0) {
    lVar1 = 0;
  }
  else {
    lVar1 = 0;
    do {
      printf("    ");
      lVar1 = lVar1 + 1;
    } while ((int)lVar1 != test_level);
  }
  printf("1..%d\n",(ulong)(test_index[lVar1] - 1));
  fflush(_stdout);
  return test_fail[test_level];
}

Assistant:

static void indent(void)
{
    int i;
    for (i = 0; i != test_level; ++i)
        printf("    ");
}